

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

uint compute_motion_cost(MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                        BLOCK_SIZE bsize,MV *this_mv)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  buf_2d *pbVar4;
  MV *pMVar5;
  uint uVar6;
  int iVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  uint sse;
  
  iVar7 = 0;
  av1_enc_build_inter_predictor(cm,xd,xd->mi_row,xd->mi_col,(BUFFER_SET *)0x0,bsize,0,0);
  pbVar4 = (ms_params->var_params).ms_buffers.src;
  uVar6 = (*((ms_params->var_params).vfp)->vf)
                    (xd->plane[0].dst.buf,xd->plane[0].dst.stride,pbVar4->buf,pbVar4->stride,&sse);
  MVar1 = (ms_params->mv_cost_params).mv_cost_type;
  if (MVar1 != '\x04') {
    pMVar5 = (ms_params->mv_cost_params).ref_mv;
    sVar2 = pMVar5->row;
    sVar3 = pMVar5->col;
    sVar10 = this_mv->row - sVar2;
    sVar8 = this_mv->col - sVar3;
    sVar11 = -sVar10;
    if (0 < sVar10) {
      sVar11 = sVar10;
    }
    sVar9 = -sVar8;
    if (0 < sVar8) {
      sVar9 = sVar8;
    }
    if (MVar1 == '\x03') {
      iVar7 = (int)sVar9 + (int)sVar11 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar7 = (int)sVar9 + (int)sVar11 >> 2;
    }
    else if (MVar1 == '\0') {
      iVar7 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar8] +
                     (long)(ms_params->mv_cost_params).mvcost[0][sVar10] +
                    (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                  (ulong)((uint)(this_mv->col != sVar3) * 4 +
                                         (uint)(this_mv->row != sVar2) * 8))) *
                    (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
    }
  }
  return iVar7 + uVar6;
}

Assistant:

static inline unsigned int compute_motion_cost(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, BLOCK_SIZE bsize,
    const MV *this_mv) {
  unsigned int mse;
  unsigned int sse;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);

  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const MSBuffers *ms_buffers = &var_params->ms_buffers;

  const uint8_t *const src = ms_buffers->src->buf;
  const int src_stride = ms_buffers->src->stride;
  const uint8_t *const dst = xd->plane[0].dst.buf;
  const int dst_stride = xd->plane[0].dst.stride;
  const aom_variance_fn_ptr_t *vfp = ms_params->var_params.vfp;

  mse = vfp->vf(dst, dst_stride, src, src_stride, &sse);
  mse += mv_err_cost_(this_mv, &ms_params->mv_cost_params);
  return mse;
}